

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O3

pair<double,_double>
Function_Template::template_Accumulate
          (AccumulateForm1 Accumulate,string *namespaceName,uint32_t size)

{
  uint32_t uVar1;
  uint32_t i;
  uint uVar2;
  pair<double,_double> pVar3;
  TimerContainer timer;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  Image image;
  allocator_type local_a9;
  double local_a8;
  double local_a0;
  ImageTemplate<unsigned_char> local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  Image local_58;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_98,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_58,size,size,&local_98);
  local_98._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_98);
  local_98._vptr_ImageTemplate =
       (_func_int **)((ulong)local_98._vptr_ImageTemplate & 0xffffffff00000000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_70,(ulong)((uint)local_58._colorCount * size * size),(value_type *)&local_98,
             &local_a9);
  SetupFunction(namespaceName);
  Performance_Test::TimerContainer::TimerContainer((TimerContainer *)&local_98);
  uVar2 = 0;
  while( true ) {
    uVar1 = Test_Helper::runCount();
    if (uVar1 <= uVar2) break;
    Performance_Test::TimerContainer::start((TimerContainer *)&local_98);
    (*Accumulate)(&local_58,&local_70);
    Performance_Test::TimerContainer::stop((TimerContainer *)&local_98);
    uVar2 = uVar2 + 1;
  }
  CleanupFunction(namespaceName);
  pVar3 = Performance_Test::BaseTimerContainer::mean((BaseTimerContainer *)&local_98);
  local_a8 = pVar3.second;
  local_a0 = pVar3.first;
  Performance_Test::TimerContainer::~TimerContainer((TimerContainer *)&local_98);
  if (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  pVar3.second = local_a8;
  pVar3.first = local_a0;
  return pVar3;
}

Assistant:

std::pair < double, double > template_Accumulate( AccumulateForm1 Accumulate , const std::string & namespaceName, uint32_t size )
    {
        const PenguinV_Image::Image image = Performance_Test::uniformImage( size, size );
        std::vector < uint32_t > result( size * size * image.colorCount(), 0u );

        TEST_FUNCTION_LOOP( Accumulate( image, result ), namespaceName )
    }